

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O2

void __thiscall
JsrtDebugManager::ReportScriptCompile
          (JsrtDebugManager *this,JavascriptFunction *scriptFunction,Utf8SourceInfo *utf8SourceInfo,
          CompileScriptException *compileException)

{
  ScriptContext *scriptContext;
  BSTR pWVar1;
  code *pcVar2;
  bool bVar3;
  UINT UVar4;
  DynamicObject *object;
  JsrtDebugDocumentManager *pJVar5;
  undefined4 *puVar6;
  HeapAllocator *this_00;
  DebugDocument *this_01;
  FunctionBody *functionBody;
  JsDiagDebugEvent debugEvent;
  undefined1 local_70 [8];
  TrackAllocData data;
  JsrtDebugEventObject debugEventObject;
  
  if (this->debugEventCallback != (JsDiagDebugEventCallback)0x0) {
    scriptContext = (utf8SourceInfo->m_scriptContext).ptr;
    JsrtDebugEventObject::JsrtDebugEventObject((JsrtDebugEventObject *)&data.line,scriptContext);
    object = JsrtDebugEventObject::GetEventDataObject((JsrtDebugEventObject *)&data.line);
    if (scriptFunction == (JavascriptFunction *)0x0) {
      pWVar1 = (compileException->super_ScriptException).ei.bstrDescription;
      UVar4 = SysStringLen(pWVar1);
      JsrtDebugUtils::AddPropertyToObject
                (object,(JsrtDebugPropertyId)0x6,pWVar1,(ulong)UVar4,scriptContext);
      JsrtDebugUtils::AddPropertyToObject
                (object,(JsrtDebugPropertyId)0x10,compileException->line,scriptContext);
      JsrtDebugUtils::AddPropertyToObject
                (object,(JsrtDebugPropertyId)0x3,
                 ~compileException->ichMinLine + (compileException->super_ScriptException).ichMin,
                 scriptContext);
      pWVar1 = compileException->bstrLine;
      UVar4 = SysStringLen(pWVar1);
      JsrtDebugUtils::AddPropertyToObject
                (object,(JsrtDebugPropertyId)0x1e,pWVar1,(ulong)UVar4,scriptContext);
      debugEvent = JsDiagDebugEventCompileError;
    }
    else {
      pJVar5 = GetDebugDocumentManager(this);
      if (pJVar5 == (JsrtDebugDocumentManager *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebugManager.cpp"
                           ,0xe9,"(debugDocumentManager != nullptr)",
                           "debugDocumentManager != nullptr");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
      }
      local_70 = (undefined1  [8])&Js::DebugDocument::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_264ab8;
      data.filename._0_4_ = 0xec;
      this_00 = Memory::HeapAllocator::TrackAllocInfo
                          (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_70);
      this_01 = (DebugDocument *)Memory::HeapAllocator::AllocT<true>(this_00,0x20);
      functionBody = Js::JavascriptFunction::GetFunctionBody(scriptFunction);
      Js::DebugDocument::DebugDocument(this_01,utf8SourceInfo,functionBody);
      debugEvent = JsDiagDebugEventSourceCompile;
      Js::Utf8SourceInfo::SetDebugDocument(utf8SourceInfo,this_01);
    }
    JsrtDebugUtils::AddSourceMetadataToObject(object,utf8SourceInfo);
    CallDebugEventCallback(this,debugEvent,object,scriptContext,false);
    JsrtDebugEventObject::~JsrtDebugEventObject((JsrtDebugEventObject *)&data.line);
  }
  return;
}

Assistant:

void JsrtDebugManager::ReportScriptCompile(Js::JavascriptFunction* scriptFunction, Js::Utf8SourceInfo* utf8SourceInfo, CompileScriptException* compileException)
{
    if (this->debugEventCallback != nullptr)
    {
        Js::ScriptContext* scriptContext = utf8SourceInfo->GetScriptContext();

        JsrtDebugEventObject debugEventObject(scriptContext);
        Js::DynamicObject* eventDataObject = debugEventObject.GetEventDataObject();

        JsDiagDebugEvent jsDiagDebugEvent = JsDiagDebugEventCompileError;

        if (scriptFunction == nullptr)
        {
            // Report JsDiagDebugEventCompileError event
            JsrtDebugUtils::AddPropertyToObject(eventDataObject, JsrtDebugPropertyId::error, compileException->ei.bstrDescription, ::SysStringLen(compileException->ei.bstrDescription), scriptContext);
            JsrtDebugUtils::AddPropertyToObject(eventDataObject, JsrtDebugPropertyId::line, compileException->line, scriptContext);
            JsrtDebugUtils::AddPropertyToObject(eventDataObject, JsrtDebugPropertyId::column, compileException->ichMin - compileException->ichMinLine - 1, scriptContext); // Converted to 0-based
            JsrtDebugUtils::AddPropertyToObject(eventDataObject, JsrtDebugPropertyId::sourceText, compileException->bstrLine, ::SysStringLen(compileException->bstrLine), scriptContext);
        }
        else
        {
            JsrtDebugDocumentManager* debugDocumentManager = this->GetDebugDocumentManager();
            Assert(debugDocumentManager != nullptr);

            // Create DebugDocument and then report JsDiagDebugEventSourceCompile event
            Js::DebugDocument* debugDocument = HeapNewNoThrow(Js::DebugDocument, utf8SourceInfo, scriptFunction->GetFunctionBody());
            if (debugDocument != nullptr)
            {
                utf8SourceInfo->SetDebugDocument(debugDocument);
            }

            jsDiagDebugEvent = JsDiagDebugEventSourceCompile;
        }

        JsrtDebugUtils::AddSourceMetadataToObject(eventDataObject, utf8SourceInfo);

        this->CallDebugEventCallback(jsDiagDebugEvent, eventDataObject, scriptContext, false /*isBreak*/);
    }
}